

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

void Dau_DecVarReplace(char *pStr,int *pPerm,int nVars)

{
  int local_20;
  int v;
  int nVars_local;
  int *pPerm_local;
  char *pStr_local;
  
  local_20 = 0;
  do {
    if (pStr[local_20] == '\0') {
      return;
    }
    if (('`' < pStr[local_20]) && (pStr[local_20] < '{')) {
      if (nVars <= pStr[local_20] + -0x61) {
        __assert_fail("pStr[v] - \'a\' < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                      ,0x233,"void Dau_DecVarReplace(char *, int *, int)");
      }
      pStr[local_20] = (char)pPerm[pStr[local_20] + -0x61] + 'a';
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void Dau_DecVarReplace( char * pStr, int * pPerm, int nVars )
{
    int v;
    for ( v = 0; pStr[v]; v++ )
        if ( pStr[v] >= 'a' && pStr[v] <= 'z' )
        {
            assert( pStr[v] - 'a' < nVars );
            pStr[v] = 'a' + pPerm[pStr[v] - 'a'];
        }
}